

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

HANDLE PAL_GetCurrentThread(void)

{
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return &DAT_ffffff03;
}

Assistant:

HANDLE
PALAPI
PAL_GetCurrentThread(
          VOID)
{
    PERF_ENTRY(GetCurrentThread);
    ENTRY("GetCurrentThread()\n");

    LOGEXIT("GetCurrentThread returns HANDLE %p\n", hPseudoCurrentThread);
    PERF_EXIT(GetCurrentThread);

    /* return a pseudo handle */
    return (HANDLE) hPseudoCurrentThread;
}